

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O1

void Acec_DetectComputeSuppOne_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp,Vec_Int_t *vNods)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int Entry;
  
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    Entry = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= Entry) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[Entry] == p->nTravIds) {
      return;
    }
    p->pTravIds[Entry] = p->nTravIds;
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((uVar2 >> 0x1e & 1) == 0) {
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCl.c"
                      ,0xcb,
                      "void Acec_DetectComputeSuppOne_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Acec_DetectComputeSuppOne_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff),vSupp,vNods);
      Acec_DetectComputeSuppOne_rec
                (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vSupp,vNods);
      pGVar1 = p->pObjs;
      if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
        Entry = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
LAB_0065e01e:
        Vec_IntPush(vNods,Entry);
        return;
      }
    }
    else {
      vNods = vSupp;
      if (pObj < pGVar1 + p->nObjs) goto LAB_0065e01e;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Acec_DetectComputeSuppOne_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp, Vec_Int_t * vNods )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( pObj->fMark0 )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Acec_DetectComputeSuppOne_rec( p, Gia_ObjFanin0(pObj), vSupp, vNods );
    Acec_DetectComputeSuppOne_rec( p, Gia_ObjFanin1(pObj), vSupp, vNods );
    Vec_IntPush( vNods, Gia_ObjId(p, pObj) );
}